

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

void __thiscall
TPZSkylMatrix<std::complex<long_double>_>::TPZSkylMatrix
          (TPZSkylMatrix<std::complex<long_double>_> *this,int64_t dim,TPZVec<long> *skyline)

{
  TPZVec<std::complex<long_double>_*> *this_00;
  complex<long_double> *local_28;
  
  TPZMatrix<std::complex<long_double>_>::TPZMatrix
            (&this->super_TPZMatrix<std::complex<long_double>_>,&PTR_PTR_016890e8,dim,dim);
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZSkylMatrix_01688e60;
  this_00 = &this->fElem;
  TPZVec<std::complex<long_double>_*>::TPZVec(this_00,dim + 1);
  TPZVec<std::complex<long_double>_>::TPZVec(&this->fStorage,0);
  local_28 = (complex<long_double> *)0x0;
  TPZVec<std::complex<long_double>_*>::Fill(this_00,&local_28,0,-1);
  InitializeElem(skyline,&this->fStorage,this_00);
  return;
}

Assistant:

TPZSkylMatrix<TVar>::TPZSkylMatrix(const int64_t dim, const TPZVec<int64_t> &skyline )
: TPZRegisterClassId(&TPZSkylMatrix::ClassId),TPZMatrix<TVar>( dim, dim ), fElem(dim+1), fStorage(0)
{
	
	// Inicializa a diagonal (vazia).
	fElem.Fill(0);
	InitializeElem(skyline,fStorage,fElem);
}